

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall IR::BranchInstr::IsLoopTail(BranchInstr *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  Type *ppBVar6;
  Type this_00;
  SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Iterator local_40;
  
  if ((func->field_0x242 & 0x20) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x7e9,"(func->isPostLower)","func->isPostLower");
    if (!bVar2) {
LAB_004b6def:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar4 = 0;
  if ((this->m_branchTarget->field_0x78 & 1) != 0) {
    pSVar7 = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
             &this->m_branchTarget->labelRefs;
    local_40.list = pSVar7;
    local_40.current = (NodeBase *)pSVar7;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    this_00 = (Type)0x0;
    while( true ) {
      if (pSVar7 == (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) goto LAB_004b6def;
        *puVar5 = 0;
        pSVar7 = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current
        ;
      }
      local_40.current =
           (((SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
            &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>)->
           super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      if ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
          local_40.list) break;
      ppBVar6 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          (&local_40);
      uVar3 = Instr::GetNumber(&(*ppBVar6)->super_Instr);
      pSVar7 = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      if (uVar4 < uVar3) {
        this_00 = *ppBVar6;
        uVar4 = Instr::GetNumber(&this_00->super_Instr);
        pSVar7 = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current
        ;
      }
    }
    uVar4 = (uint32)(this_00 == this);
  }
  return SUB41(uVar4,0);
}

Assistant:

bool
BranchInstr::IsLoopTail(Func * func)
{
    Assert(func->isPostLower);
    IR::LabelInstr * target = this->GetTarget();
    if (!target->m_isLoopTop)
    {
        return false;
    }

    IR::BranchInstr * lastBranchInstr = nullptr;
    uint32 lastBranchNum = 0;
    FOREACH_SLISTCOUNTED_ENTRY(IR::BranchInstr *, ref, &target->labelRefs)
    {
        if (ref->GetNumber() > lastBranchNum)
        {
            lastBranchInstr = ref;
            lastBranchNum = lastBranchInstr->GetNumber();
        }
    }
    NEXT_SLISTCOUNTED_ENTRY;

    if (this == lastBranchInstr)
    {
        return true;
    }
    return false;
}